

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void __thiscall
RPCResult::RPCResult
          (RPCResult *this,Type type,string m_key_name,string description,
          vector<RPCResult,_std::allocator<RPCResult>_> inner,bool skip_type_check)

{
  long lVar1;
  _Alloc_hider _Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  string m_key_name_00;
  string description_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined7 in_register_00000011;
  undefined8 *in_R8;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  undefined1 in_stack_ffffffffffffff5c [12];
  undefined1 in_stack_ffffffffffffff80 [24];
  _Vector_impl_data in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffa8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71(in_register_00000011,skip_type_check));
  std::__cxx11::string::string((string *)&stack0xffffffffffffff88,in_RCX);
  uVar3 = *in_R8;
  uVar4 = in_R8[1];
  _Var2._M_p = (pointer)in_R8[2];
  *in_R8 = 0;
  in_R8[1] = 0;
  in_R8[2] = 0;
  m_key_name_00._4_12_ = in_stack_ffffffffffffff5c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_R9D;
  m_key_name_00.field_2._M_allocated_capacity = uVar3;
  m_key_name_00.field_2._8_8_ = uVar4;
  description_00._M_string_length = in_stack_ffffffffffffff80._0_8_;
  description_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffff80._8_16_;
  description_00._M_dataplus._M_p = _Var2._M_p;
  RPCResult(this,type,m_key_name_00,SUB81(&stack0xffffffffffffffa8,0),description_00,
            (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_ffffffffffffff98,false);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffff68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCResult(
        Type type,
        std::string m_key_name,
        std::string description,
        std::vector<RPCResult> inner = {},
        bool skip_type_check = false)
        : RPCResult{type, std::move(m_key_name), /*optional=*/false, std::move(description), std::move(inner), skip_type_check} {}